

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnlabeledValueArg.h
# Opt level: O2

void __thiscall
TCLAP::
UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::UnlabeledValueArg(UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *this,string *name,string *desc,bool req,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,
                   string *typeDesc,CmdLineInterface *parser,bool ignoreable,Visitor *v)

{
  allocator local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_70,"",&local_71);
  std::__cxx11::string::string((string *)&local_50,(string *)val);
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ValueArg(&this->
            super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ,&local_70,name,desc,req,&local_50,typeDesc,v);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  (this->
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_0014db68;
  (this->
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_Arg._ignoreable = ignoreable;
  Arg::toString_abi_cxx11_(&local_70,(Arg *)this);
  OptionalUnlabeledTracker::check(req,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  (*parser->_vptr_CmdLineInterface[3])(parser,this);
  return;
}

Assistant:

UnlabeledValueArg<T>::UnlabeledValueArg(const std::string& name, 
					                    const std::string& desc, 
										bool req,
					                    T val,
					                    const std::string& typeDesc,
					                    CmdLineInterface& parser,
					                    bool ignoreable,
					                    Visitor* v)
: ValueArg<T>("", name, desc, req, val, typeDesc, v)
{ 
	_ignoreable = ignoreable;
	OptionalUnlabeledTracker::check(req, toString());
	parser.add( this );
}